

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::evaluateCollocationConstraint
          (ForwardEuler *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,VectorDynSize *constraintValue)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  element_type *peVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ostream *poVar19;
  string *psVar20;
  ulong uVar21;
  long lVar22;
  char *pcVar23;
  ulong uVar24;
  pointer pcVar25;
  ostringstream errorMsg;
  long *local_1e0;
  long local_1d0 [2];
  double local_1c0;
  double local_1b8;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  if ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    psVar20 = IntegratorInfo::name_abi_cxx11_
                        (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
    pcVar25 = (psVar20->_M_dataplus)._M_p;
    pcVar23 = "Dynamical system not set.";
LAB_0017de89:
    iDynTree::reportError(pcVar25,"evaluateCollocationConstraint",pcVar23);
  }
  else {
    if ((long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      if ((controlInputs->
          super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>).
          _M_impl.super__Vector_impl_data._M_finish !=
          (controlInputs->
          super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>).
          _M_impl.super__Vector_impl_data._M_start) {
        local_1c0 = time;
        local_1b8 = dT;
        sVar11 = iDynTree::VectorDynSize::size();
        sVar12 = DynamicalSystem::stateSpaceSize
                           ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr
                            .
                            super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        if (sVar11 != sVar12) {
          DynamicalSystem::stateSpaceSize
                    ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          iDynTree::VectorDynSize::resize((ulong)constraintValue);
        }
        peVar6 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                 super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar10 = (*peVar6->_vptr_DynamicalSystem[3])
                           (peVar6,(controlInputs->
                                   super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
        if ((char)iVar10 == '\0') {
          psVar20 = IntegratorInfo::name_abi_cxx11_
                              (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar25 = (psVar20->_M_dataplus)._M_p;
          pcVar23 = "Error while setting the control input.";
        }
        else {
          peVar6 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          iVar10 = (*peVar6->_vptr_DynamicalSystem[2])
                             (local_1c0,peVar6,
                              (collocationPoints->
                              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                              )._M_impl.super__Vector_impl_data._M_start,&this->m_computationBuffer)
          ;
          if ((char)iVar10 != '\0') {
            lVar13 = iDynTree::VectorDynSize::data();
            iDynTree::VectorDynSize::size();
            lVar14 = iDynTree::VectorDynSize::data();
            iDynTree::VectorDynSize::size();
            lVar15 = iDynTree::VectorDynSize::data();
            iDynTree::VectorDynSize::size();
            uVar16 = iDynTree::VectorDynSize::data();
            uVar17 = iDynTree::VectorDynSize::size();
            uVar24 = uVar17;
            if (((uVar16 & 7) == 0) &&
               (uVar24 = (ulong)((uint)(uVar16 >> 3) & 1), (long)uVar17 <= (long)uVar24)) {
              uVar24 = uVar17;
            }
            lVar22 = uVar17 - uVar24;
            if (0 < (long)uVar24) {
              uVar21 = 0;
              do {
                *(double *)(uVar16 + uVar21 * 8) =
                     *(double *)(lVar15 + uVar21 * 8) * local_1b8 +
                     (*(double *)(lVar14 + uVar21 * 8) - *(double *)(lVar13 + uVar21 * 8));
                uVar21 = uVar21 + 1;
              } while (uVar24 != uVar21);
            }
            lVar1 = (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU) + uVar24;
            uVar21 = uVar24;
            if (1 < lVar22) {
              do {
                pdVar2 = (double *)(lVar13 + uVar21 * 8);
                dVar7 = pdVar2[1];
                pdVar3 = (double *)(lVar14 + uVar21 * 8);
                dVar8 = pdVar3[1];
                pdVar4 = (double *)(lVar15 + uVar21 * 8);
                dVar9 = pdVar4[1];
                pdVar5 = (double *)(uVar16 + uVar21 * 8);
                *pdVar5 = *pdVar4 * local_1b8 + (*pdVar3 - *pdVar2);
                pdVar5[1] = dVar9 * local_1b8 + (dVar8 - dVar7);
                uVar21 = uVar21 + 2;
              } while ((long)uVar21 < lVar1);
            }
            if ((long)uVar17 <= lVar1) {
              return true;
            }
            lVar1 = (lVar22 / 2) * 0x10 + uVar24 * 8;
            lVar18 = 0;
            do {
              *(double *)(uVar16 + lVar1 + lVar18 * 8) =
                   *(double *)(lVar15 + lVar1 + lVar18 * 8) * local_1b8 +
                   (*(double *)(lVar14 + lVar1 + lVar18 * 8) -
                   *(double *)(lVar13 + lVar1 + lVar18 * 8));
              lVar18 = lVar18 + 1;
            } while (lVar22 % 2 != lVar18);
            return true;
          }
          psVar20 = IntegratorInfo::name_abi_cxx11_
                              (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar25 = (psVar20->_M_dataplus)._M_p;
          pcVar23 = "Error while evaluating the dynamical system.";
        }
        goto LAB_0017de89;
      }
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "The size of the matrix containing the control inputs does not match the expected one. Input = "
                 ,0x5e);
      poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", Expected = 1 (at least).",0x1a);
      psVar20 = IntegratorInfo::name_abi_cxx11_
                          (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar23 = (psVar20->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError(pcVar23,"evaluateCollocationConstraint",(char *)local_1e0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "The size of the matrix containing the collocation point does not match the expected one. Input = "
                 ,0x61);
      poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", Expected = 2.",0xf);
      psVar20 = IntegratorInfo::name_abi_cxx11_
                          (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar23 = (psVar20->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError(pcVar23,"evaluateCollocationConstraint",(char *)local_1e0);
    }
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return false;
}

Assistant:

bool ForwardEuler::evaluateCollocationConstraint(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                             const std::vector<VectorDynSize> &controlInputs,
                                                             double dT, VectorDynSize &constraintValue)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() < 1){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 1 (at least).";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", errorMsg.str().c_str());
                    return false;
                }

                if (constraintValue.size() != m_dynamicalSystem_ptr->stateSpaceSize()) {
                    constraintValue.resize(static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize()));
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamics(collocationPoints[0], time, m_computationBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Error while evaluating the dynamical system.");
                    return false;
                }

                toEigen(constraintValue) = -toEigen(collocationPoints[1]) + toEigen(collocationPoints[0]) +
                        dT*toEigen(m_computationBuffer);

                return true;
            }